

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

char16_t * __thiscall icu_63::number::impl::DecimalQuantity::checkHealth(DecimalQuantity *this)

{
  char *pcVar1;
  char16_t *pcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar4 = this->precision;
  uVar5 = (ulong)uVar4;
  if (this->usingBytes == true) {
    if (uVar4 == 0) {
      pcVar2 = L"Zero precision but we are in byte mode";
    }
    else {
      iVar3 = (this->fBCD).bcdBytes.len;
      if (iVar3 < (int)uVar4) {
        return L"Precision exceeds length of byte array";
      }
      pcVar2 = L"Most significant digit is zero in byte mode";
      if ((0 < (int)uVar4) && (pcVar1 = (this->fBCD).bcdBytes.ptr, pcVar1[uVar5 - 1] != '\0')) {
        if (*pcVar1 == '\0') goto LAB_00218032;
        uVar7 = 0;
        do {
          if ('\t' < pcVar1[uVar7]) {
            return L"Digit exceeding 10 in byte array";
          }
          if (pcVar1[uVar7] < '\0') {
            return L"Digit below 0 in byte array";
          }
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
        if (iVar3 <= (int)uVar4) {
          return (char16_t *)0x0;
        }
        pcVar2 = (char16_t *)0x0;
        uVar7 = uVar5;
        do {
          if ((uVar7 < uVar5) && (pcVar1[uVar7] != '\0')) {
            return L"Nonzero digits outside of range in byte array";
          }
          uVar7 = uVar7 + 1;
        } while ((int)uVar7 < iVar3);
      }
    }
    return pcVar2;
  }
  uVar7 = (this->fBCD).bcdLong;
  if (uVar7 != 0 && uVar4 == 0) {
    return L"Value in bcdLong even though precision is zero";
  }
  if (0x10 < (int)uVar4) {
    return L"Precision exceeds length of long";
  }
  if (uVar4 != 0) {
    if (0xf < uVar4 - 1) {
      return L"Most significant digit is zero in long mode";
    }
    if ((uVar7 >> ((char)(uVar4 - 1) * '\x04' & 0x3fU) & 0xf) == 0) {
      return L"Most significant digit is zero in long mode";
    }
    if ((uVar7 & 0xf) == 0) {
LAB_00218032:
      return L"Least significant digit is zero in long mode";
    }
    uVar8 = 0;
    do {
      if ((uVar8 < 0x10) && (9 < ((uint)(uVar7 >> ((char)uVar8 * '\x04' & 0x3fU)) & 0xe))) {
        return L"Digit exceeding 10 in long";
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
    if (uVar4 == 0x10) {
      return (char16_t *)0x0;
    }
  }
  uVar6 = 0xf;
  if (0xf < (int)uVar4) {
    uVar6 = uVar4;
  }
  iVar3 = uVar4 * 4;
  while ((0xf < (uint)uVar5 || ((uVar7 >> ((byte)iVar3 & 0x3f) & 0xf) == 0))) {
    uVar4 = (uint)uVar5 + 1;
    uVar5 = (ulong)uVar4;
    iVar3 = iVar3 + 4;
    if (uVar6 + 1 == uVar4) {
      return (char16_t *)0x0;
    }
  }
  return L"Nonzero digits outside of range in long";
}

Assistant:

const char16_t* DecimalQuantity::checkHealth() const {
    if (usingBytes) {
        if (precision == 0) { return u"Zero precision but we are in byte mode"; }
        int32_t capacity = fBCD.bcdBytes.len;
        if (precision > capacity) { return u"Precision exceeds length of byte array"; }
        if (getDigitPos(precision - 1) == 0) { return u"Most significant digit is zero in byte mode"; }
        if (getDigitPos(0) == 0) { return u"Least significant digit is zero in long mode"; }
        for (int i = 0; i < precision; i++) {
            if (getDigitPos(i) >= 10) { return u"Digit exceeding 10 in byte array"; }
            if (getDigitPos(i) < 0) { return u"Digit below 0 in byte array"; }
        }
        for (int i = precision; i < capacity; i++) {
            if (getDigitPos(i) != 0) { return u"Nonzero digits outside of range in byte array"; }
        }
    } else {
        if (precision == 0 && fBCD.bcdLong != 0) {
            return u"Value in bcdLong even though precision is zero";
        }
        if (precision > 16) { return u"Precision exceeds length of long"; }
        if (precision != 0 && getDigitPos(precision - 1) == 0) {
            return u"Most significant digit is zero in long mode";
        }
        if (precision != 0 && getDigitPos(0) == 0) {
            return u"Least significant digit is zero in long mode";
        }
        for (int i = 0; i < precision; i++) {
            if (getDigitPos(i) >= 10) { return u"Digit exceeding 10 in long"; }
            if (getDigitPos(i) < 0) { return u"Digit below 0 in long (?!)"; }
        }
        for (int i = precision; i < 16; i++) {
            if (getDigitPos(i) != 0) { return u"Nonzero digits outside of range in long"; }
        }
    }

    // No error
    return nullptr;
}